

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O0

float __thiscall embree::Distribution1D::pdf(Distribution1D *this,float p)

{
  const_reference pvVar1;
  ulong *in_RDI;
  float in_XMM0_Da;
  int local_68;
  int local_64;
  float local_44;
  int local_40 [6];
  int *local_28;
  int *local_20;
  int *local_18;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_44 = (float)*in_RDI;
  local_40[2] = (int)(in_XMM0_Da * local_44);
  local_40[1] = 0;
  local_40[0] = (int)*in_RDI + -1;
  local_18 = local_40 + 2;
  local_20 = local_40 + 1;
  local_28 = local_40;
  local_64 = local_40[0];
  if (local_40[2] < local_40[0]) {
    local_64 = local_40[2];
  }
  local_10 = 0;
  local_c = local_64;
  local_68 = local_10;
  if (-1 < local_64) {
    local_68 = local_64;
  }
  local_8 = local_40[0];
  local_4 = local_40[2];
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 1),(long)local_68);
  return *pvVar1;
}

Assistant:

float Distribution1D::pdf(const float p) const {
    return PDF[clamp(int(p*size),0,int(size)-1)];
  }